

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  basic_fp<unsigned___int128> value_00;
  uint128_fallback y;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  unsigned_long uVar7;
  carrier_uint cVar8;
  ulong uVar9;
  uint64_t uVar10;
  char *pcVar11;
  buffer<char> *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  decimal_fp<double> dVar12;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  basic_fp<unsigned___int128> f;
  int i;
  uint32_t fractional_part_1;
  uint32_t third_subsegment;
  uint32_t second_subsegment;
  uint32_t fractional_part;
  anon_class_24_3_5eee03a8 print_subsegment;
  int number_of_digits_to_print;
  bool should_round_up;
  uint32_t digits;
  uint64_t prod;
  uint64_t second_third_subsegments;
  uint32_t first_subsegment;
  uint128_fallback r;
  int digits_in_the_first_segment;
  bool has_more_segments;
  uint64_t first_segment;
  int beta;
  int k;
  int shift;
  int exponent;
  uint64_t significand;
  uint64_t significand_mask;
  unsigned_long br;
  decimal_fp<double> dec;
  decimal_fp<float> dec_1;
  uint dragon_flags;
  bool use_dragon;
  int exp;
  uint in_stack_000001e4;
  bool fixed;
  convert_float_result<double> converted_value;
  undefined4 in_stack_000001f8;
  undefined4 in_stack_00000208;
  buffer<char> *in_stack_fffffffffffffde8;
  buffer<char> *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  buffer<char> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  buffer<char> *in_stack_fffffffffffffe10;
  byte local_1e7;
  byte local_1e6;
  byte local_1e5;
  bool local_1dd;
  undefined1 in_stack_fffffffffffffe28;
  byte in_stack_fffffffffffffe29;
  byte in_stack_fffffffffffffe2a;
  byte in_stack_fffffffffffffe2b;
  uint in_stack_fffffffffffffe2c;
  uint uVar13;
  undefined3 uVar14;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  int local_1c8;
  uint in_stack_fffffffffffffe54;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffe58;
  unsigned_long in_stack_fffffffffffffe60;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffe68;
  size_t local_190;
  undefined8 in_stack_fffffffffffffe78;
  float x;
  undefined1 local_158 [44];
  int local_12c;
  uint local_128;
  uint local_124;
  int local_120;
  uint local_11c;
  undefined1 *local_118;
  uint *local_110;
  uint *local_108;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  bool local_f5;
  uint local_f4;
  uint local_f0 [2];
  ulong local_e8;
  uint local_dc;
  uint128_fallback local_d8;
  uint128_fallback local_c8;
  int local_b8;
  byte local_b1;
  ulong local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  ulong local_98;
  undefined8 local_90;
  double local_88;
  unsigned_long local_80;
  significand_type local_68;
  int local_60;
  decimal_fp<float> local_48;
  uint local_40;
  byte local_39;
  int local_38;
  undefined1 local_32;
  byte local_31;
  convert_float_result<double> local_30;
  buffer<char> *local_28;
  int local_1c;
  double local_18;
  undefined8 local_c;
  int local_4;
  
  x = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if (in_XMM0_Qa < 0.0) {
    assert_fail((char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                (char *)0x21ff33);
  }
  local_28 = in_RDX;
  local_1c = in_EDI;
  local_18 = in_XMM0_Qa;
  local_c = in_RSI;
  local_30 = convert_float<double>(in_XMM0_Qa);
  local_31 = (char)((ulong)local_c >> 0x20) == '\x02';
  if (0.0 < local_18) {
    local_38 = 0;
    local_39 = 1;
    local_40 = 0;
    if (local_1c < 0) {
      if ((local_c._4_4_ >> 0x12 & 1) == 0) {
        dVar12 = dragonbox::to_decimal<double>
                           ((double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        local_68 = dVar12.significand;
        local_60 = dVar12.exponent;
        appender::back_insert_iterator
                  ((appender *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        write<char,_fmt::v10::appender,_unsigned_long,_0>
                  ((appender)in_stack_fffffffffffffe68.container,in_stack_fffffffffffffe60);
        local_4 = local_60;
      }
      else {
        local_48 = dragonbox::to_decimal<float>(x);
        appender::back_insert_iterator
                  ((appender *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        write<char,_fmt::v10::appender,_unsigned_int,_0>
                  ((appender)in_stack_fffffffffffffe58.container,in_stack_fffffffffffffe54);
        local_4 = local_48.exponent;
      }
    }
    else {
      local_88 = local_18;
      uVar7 = bit_cast<unsigned_long,_double,_0>(&local_88);
      iVar3 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      local_90 = 0xfffffffffffff;
      local_98 = uVar7 & 0xfffffffffffff;
      local_80 = uVar7;
      cVar8 = exponent_mask<double>();
      uVar9 = uVar7 & cVar8;
      iVar2 = num_significand_bits<double>();
      local_9c = (int)(uVar9 >> ((byte)iVar2 & 0x3f));
      if (local_9c == 0) {
        if (local_98 == 0) {
          assert_fail((char *)in_stack_fffffffffffffdf0,iVar3,(char *)0x220233);
        }
        iVar2 = countl_zero(local_98);
        local_a0 = iVar2;
        iVar4 = num_bits<unsigned_long>();
        iVar5 = num_significand_bits<double>();
        if (iVar2 < iVar4 - iVar5) {
          assert_fail((char *)in_stack_fffffffffffffdf0,iVar3,(char *)0x22028a);
        }
        iVar2 = num_bits<unsigned_long>();
        iVar3 = num_significand_bits<double>();
        local_a0 = local_a0 - ((iVar2 - iVar3) + -2);
        iVar2 = num_significand_bits<double>();
        local_9c = (-0x3fd - iVar2) - local_a0;
        local_98 = local_98 << ((byte)local_a0 & 0x3f);
      }
      else {
        iVar2 = exponent_bias<double>();
        iVar3 = num_significand_bits<double>();
        local_9c = local_9c - (iVar2 + iVar3);
        iVar2 = num_significand_bits<double>();
        local_98 = (1L << ((byte)iVar2 & 0x3f) | local_98) << 1;
      }
      local_a4 = dragonbox::floor_log10_pow2(0);
      iVar2 = local_9c;
      local_a4 = 2 - local_a4;
      local_38 = -local_a4;
      local_a8 = dragonbox::floor_log2_pow10(0);
      local_a8 = iVar2 + local_a8;
      local_d8 = dragonbox::get_cached_power(0);
      y.lo_._4_2_ = in_stack_fffffffffffffe0c;
      y.lo_._0_4_ = in_stack_fffffffffffffe08;
      y.lo_._6_1_ = in_stack_fffffffffffffe0e;
      y.lo_._7_1_ = in_stack_fffffffffffffe0f;
      y.hi_ = (uint64_t)in_stack_fffffffffffffe10;
      local_c8 = dragonbox::umul192_upper128((uint64_t)in_stack_fffffffffffffe00,y);
      local_b0 = uint128_fallback::high(&local_c8);
      uVar10 = uint128_fallback::low(&local_c8);
      local_b1 = uVar10 != 0;
      if (local_b0 < 1000000000000000000) {
        local_b8 = 0x12;
        local_b0 = local_b0 * 10;
      }
      else {
        local_b8 = 0x13;
      }
      if ((local_31 & 1) != 0) {
        adjust_precision((int *)in_stack_fffffffffffffe00,(int)(in_stack_fffffffffffffdf8 >> 0x20));
      }
      if (local_1c < local_b8) {
        local_39 = 0;
        if (local_1c < 1) {
          local_38 = local_b8 + local_38;
          if (local_1c < 0) {
            buffer<char>::try_resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          }
          else {
            buffer<char>::try_resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            if ((local_b0 | local_b1 & 1) < 0x4563918244f40001) {
              pcVar11 = buffer<char>::operator[]<int>(local_28,0);
              *pcVar11 = '0';
            }
            else {
              pcVar11 = buffer<char>::operator[]<int>(local_28,0);
              *pcVar11 = '1';
            }
          }
        }
        else {
          local_38 = (local_b8 - local_1c) + local_38;
          uVar10 = dragonbox::umul128_upper64(local_b0,0x6df37f675ef6eae0);
          in_stack_fffffffffffffe34 = (uint)(uVar10 >> 0x20);
          local_e8 = local_b0 + (ulong)in_stack_fffffffffffffe34 * -10000000000;
          if (local_1c < 10) {
            local_1c8 = local_1c;
          }
          else {
            local_1c8 = 9;
          }
          local_118 = &stack0xffffffffffffff04;
          local_110 = local_f0;
          local_108 = &local_f4;
          local_dc = in_stack_fffffffffffffe34;
          buffer<char>::data(local_28);
          format_float<double>::anon_class_24_3_5eee03a8::operator()
                    ((anon_class_24_3_5eee03a8 *)in_stack_fffffffffffffe10,
                     CONCAT13(in_stack_fffffffffffffe0f,
                              CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                     (char *)in_stack_fffffffffffffe00);
          uVar13 = local_f0[0];
          if (local_1c < 10) {
            if (local_1c < 9) {
              local_11c = local_f0[0];
              uVar6 = fractional_part_rounding_thresholds(8 - local_1c8);
              uVar14 = (undefined3)in_stack_fffffffffffffe30;
              in_stack_fffffffffffffe30 = CONCAT13(1,uVar14);
              if (uVar13 < uVar6) {
                in_stack_fffffffffffffe30 =
                     CONCAT13((local_11c >> 0x1f &
                              (local_f4 & 1 | (uint)(local_e8 != 0) | (uint)(local_b1 & 1))) != 0,
                              uVar14);
              }
              local_f5 = SUB41((uint)in_stack_fffffffffffffe30 >> 0x18,0);
              in_stack_fffffffffffffe2c = uVar13;
            }
            else {
              in_stack_fffffffffffffe2b = 1;
              if (((local_e8 < 0x12a05f201) &&
                  (in_stack_fffffffffffffe2a = 0, in_stack_fffffffffffffe2b = 0,
                  local_e8 == 5000000000)) &&
                 (in_stack_fffffffffffffe29 = 1,
                 in_stack_fffffffffffffe2a = in_stack_fffffffffffffe29,
                 in_stack_fffffffffffffe2b = in_stack_fffffffffffffe29, (local_f4 & 1) == 0)) {
                in_stack_fffffffffffffe29 = local_b1;
                in_stack_fffffffffffffe2a = local_b1;
                in_stack_fffffffffffffe2b = local_b1;
              }
              local_f5 = (bool)(in_stack_fffffffffffffe2b & 1);
            }
          }
          else {
            local_f0[0] = uVar13;
            uVar10 = dragonbox::umul128_upper64(local_e8,0x199999999999999a);
            local_120 = (int)uVar10;
            local_124 = (int)local_e8 + local_120 * -10;
            iVar2 = local_1c + -9;
            buffer<char>::data(local_28);
            format_float<double>::anon_class_24_3_5eee03a8::operator()
                      ((anon_class_24_3_5eee03a8 *)in_stack_fffffffffffffe10,
                       CONCAT13(in_stack_fffffffffffffe0f,
                                CONCAT12(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)),
                       (char *)in_stack_fffffffffffffe00);
            if (local_1c < 0x12) {
              local_128 = local_f0[0];
              uVar6 = fractional_part_rounding_thresholds(8 - iVar2);
              local_1dd = true;
              if (local_f0[0] < uVar6) {
                local_1dd = (local_128 >> 0x1f &
                            (local_f4 & 1 | (uint)(local_124 != 0) | (uint)(local_b1 & 1))) != 0;
              }
              local_f5 = local_1dd;
            }
            else {
              local_1e5 = 1;
              if (local_124 < 6) {
                local_1e6 = 0;
                if (local_124 == 5) {
                  local_1e7 = 1;
                  if ((local_f4 & 1) == 0) {
                    local_1e7 = local_b1;
                  }
                  local_1e6 = local_1e7;
                }
                local_1e5 = local_1e6;
              }
              local_f5 = (bool)(local_1e5 & 1);
            }
          }
          if (local_f5 != false) {
            pcVar11 = buffer<char>::operator[]<int>(local_28,local_1c + -1);
            *pcVar11 = *pcVar11 + '\x01';
            local_12c = local_1c;
            while( true ) {
              local_12c = local_12c + -1;
              bVar1 = false;
              if (0 < local_12c) {
                pcVar11 = buffer<char>::operator[]<int>(local_28,local_12c);
                bVar1 = '9' < *pcVar11;
              }
              if (!bVar1) break;
              pcVar11 = buffer<char>::operator[]<int>(local_28,local_12c);
              *pcVar11 = '0';
              pcVar11 = buffer<char>::operator[]<int>(local_28,local_12c + -1);
              *pcVar11 = *pcVar11 + '\x01';
            }
            pcVar11 = buffer<char>::operator[]<int>(local_28,0);
            if ('9' < *pcVar11) {
              pcVar11 = buffer<char>::operator[]<int>(local_28,0);
              iVar2 = local_1c;
              *pcVar11 = '1';
              if ((local_31 & 1) == 0) {
                local_38 = local_38 + 1;
              }
              else {
                local_1c = local_1c + 1;
                pcVar11 = buffer<char>::operator[]<int>(local_28,iVar2);
                *pcVar11 = '0';
              }
            }
          }
          in_stack_fffffffffffffe10 = local_28;
          to_unsigned<int>(0);
          buffer<char>::try_resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        }
      }
      else {
        local_38 = local_b8 + -1 + local_38;
      }
      if ((local_39 & 1) != 0) {
        basic_fp<unsigned___int128>::basic_fp((basic_fp<unsigned___int128> *)local_158);
        if ((local_c._4_4_ >> 0x12 & 1) == 0) {
          bVar1 = basic_fp<unsigned___int128>::assign<double,_0>
                            ((basic_fp<unsigned___int128> *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             (double)CONCAT44(in_stack_fffffffffffffe2c,
                                              CONCAT13(in_stack_fffffffffffffe2b,
                                                       CONCAT12(in_stack_fffffffffffffe2a,
                                                                CONCAT11(in_stack_fffffffffffffe29,
                                                                         in_stack_fffffffffffffe28))
                                                      )));
        }
        else {
          bVar1 = basic_fp<unsigned___int128>::assign<float,_0>
                            ((basic_fp<unsigned___int128> *)in_stack_fffffffffffffe10,
                             (float)CONCAT13(in_stack_fffffffffffffe0f,
                                             CONCAT12(in_stack_fffffffffffffe0e,
                                                      in_stack_fffffffffffffe0c)));
        }
        if (bVar1 != false) {
          local_40 = local_40 | 1;
        }
        if ((local_31 & 1) != 0) {
          local_40 = local_40 | 4;
        }
        if (0x2ff < local_1c) {
          local_1c = 0x2ff;
        }
        value_00.f._8_4_ = in_stack_000001f8;
        value_00.f._0_8_ = buf;
        value_00.f._12_4_ = precision;
        value_00._16_8_ = value;
        value_00._24_4_ = in_stack_00000208;
        value_00._28_4_ = specs.precision;
        format_dragon(value_00,in_stack_000001e4,exp,_dragon_flags,(int *)dec_1);
        in_stack_fffffffffffffdf8 = local_158._16_8_;
        in_stack_fffffffffffffe00 = (buffer<char> *)local_158._24_8_;
      }
      if (((local_31 & 1) == 0) && ((local_c._4_4_ >> 0x13 & 1) == 0)) {
        local_190 = buffer<char>::size(local_28);
        while( true ) {
          bVar1 = false;
          if (local_190 != 0) {
            pcVar11 = buffer<char>::operator[]<unsigned_long>(local_28,local_190 - 1);
            bVar1 = *pcVar11 == '0';
          }
          if (!bVar1) break;
          local_190 = local_190 - 1;
          local_38 = local_38 + 1;
        }
        buffer<char>::try_resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
      local_4 = local_38;
    }
  }
  else if ((local_1c < 1) || (!(bool)local_31)) {
    local_32 = 0x30;
    buffer<char>::push_back(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
    local_4 = 0;
  }
  else {
    to_unsigned<int>(0);
    buffer<char>::try_resize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    buffer<char>::data(local_28);
    fill_n<char,int>((char *)in_stack_fffffffffffffdf0,
                     (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     (char)((ulong)in_stack_fffffffffffffde8 >> 0x18));
    local_4 = -local_1c;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>() || is_constant_evaluated()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    auto e = (f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10;
    exp = static_cast<int>(e);
    if (e > exp) ++exp;  // Compute ceil.
    dragon_flags = dragon::fixup;
  } else if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Extract significand bits and exponent bits.
    using info = dragonbox::float_info<double>;
    auto br = bit_cast<uint64_t>(static_cast<double>(value));

    const uint64_t significand_mask =
        (static_cast<uint64_t>(1) << num_significand_bits<double>()) - 1;
    uint64_t significand = (br & significand_mask);
    int exponent = static_cast<int>((br & exponent_mask<double>()) >>
                                    num_significand_bits<double>());

    if (exponent != 0) {  // Check if normal.
      exponent -= exponent_bias<double>() + num_significand_bits<double>();
      significand |=
          (static_cast<uint64_t>(1) << num_significand_bits<double>());
      significand <<= 1;
    } else {
      // Normalize subnormal inputs.
      FMT_ASSERT(significand != 0, "zeros should not appear here");
      int shift = countl_zero(significand);
      FMT_ASSERT(shift >= num_bits<uint64_t>() - num_significand_bits<double>(),
                 "");
      shift -= (num_bits<uint64_t>() - num_significand_bits<double>() - 2);
      exponent = (std::numeric_limits<double>::min_exponent -
                  num_significand_bits<double>()) -
                 shift;
      significand <<= shift;
    }

    // Compute the first several nonzero decimal significand digits.
    // We call the number we get the first segment.
    const int k = info::kappa - dragonbox::floor_log10_pow2(exponent);
    exp = -k;
    const int beta = exponent + dragonbox::floor_log2_pow10(k);
    uint64_t first_segment;
    bool has_more_segments;
    int digits_in_the_first_segment;
    {
      const auto r = dragonbox::umul192_upper128(
          significand << beta, dragonbox::get_cached_power(k));
      first_segment = r.high();
      has_more_segments = r.low() != 0;

      // The first segment can have 18 ~ 19 digits.
      if (first_segment >= 1000000000000000000ULL) {
        digits_in_the_first_segment = 19;
      } else {
        // When it is of 18-digits, we align it to 19-digits by adding a bogus
        // zero at the end.
        digits_in_the_first_segment = 18;
        first_segment *= 10;
      }
    }

    // Compute the actual number of decimal digits to print.
    if (fixed) adjust_precision(precision, exp + digits_in_the_first_segment);

    // Use Dragon4 only when there might be not enough digits in the first
    // segment.
    if (digits_in_the_first_segment > precision) {
      use_dragon = false;

      if (precision <= 0) {
        exp += digits_in_the_first_segment;

        if (precision < 0) {
          // Nothing to do, since all we have are just leading zeros.
          buf.try_resize(0);
        } else {
          // We may need to round-up.
          buf.try_resize(1);
          if ((first_segment | static_cast<uint64_t>(has_more_segments)) >
              5000000000000000000ULL) {
            buf[0] = '1';
          } else {
            buf[0] = '0';
          }
        }
      }  // precision <= 0
      else {
        exp += digits_in_the_first_segment - precision;

        // When precision > 0, we divide the first segment into three
        // subsegments, each with 9, 9, and 0 ~ 1 digits so that each fits
        // in 32-bits which usually allows faster calculation than in
        // 64-bits. Since some compiler (e.g. MSVC) doesn't know how to optimize
        // division-by-constant for large 64-bit divisors, we do it here
        // manually. The magic number 7922816251426433760 below is equal to
        // ceil(2^(64+32) / 10^10).
        const uint32_t first_subsegment = static_cast<uint32_t>(
            dragonbox::umul128_upper64(first_segment, 7922816251426433760ULL) >>
            32);
        const uint64_t second_third_subsegments =
            first_segment - first_subsegment * 10000000000ULL;

        uint64_t prod;
        uint32_t digits;
        bool should_round_up;
        int number_of_digits_to_print = precision > 9 ? 9 : precision;

        // Print a 9-digits subsegment, either the first or the second.
        auto print_subsegment = [&](uint32_t subsegment, char* buffer) {
          int number_of_digits_printed = 0;

          // If we want to print an odd number of digits from the subsegment,
          if ((number_of_digits_to_print & 1) != 0) {
            // Convert to 64-bit fixed-point fractional form with 1-digit
            // integer part. The magic number 720575941 is a good enough
            // approximation of 2^(32 + 24) / 10^8; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(720575941)) >> 24) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            *buffer = static_cast<char>('0' + digits);
            number_of_digits_printed++;
          }
          // If we want to print an even number of digits from the
          // first_subsegment,
          else {
            // Convert to 64-bit fixed-point fractional form with 2-digits
            // integer part. The magic number 450359963 is a good enough
            // approximation of 2^(32 + 20) / 10^7; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(450359963)) >> 20) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            copy2(buffer, digits2(digits));
            number_of_digits_printed += 2;
          }

          // Print all digit pairs.
          while (number_of_digits_printed < number_of_digits_to_print) {
            prod = static_cast<uint32_t>(prod) * static_cast<uint64_t>(100);
            digits = static_cast<uint32_t>(prod >> 32);
            copy2(buffer + number_of_digits_printed, digits2(digits));
            number_of_digits_printed += 2;
          }
        };

        // Print first subsegment.
        print_subsegment(first_subsegment, buf.data());

        // Perform rounding if the first subsegment is the last subsegment to
        // print.
        if (precision <= 9) {
          // Rounding inside the subsegment.
          // We round-up if:
          //  - either the fractional part is strictly larger than 1/2, or
          //  - the fractional part is exactly 1/2 and the last digit is odd.
          // We rely on the following observations:
          //  - If fractional_part >= threshold, then the fractional part is
          //    strictly larger than 1/2.
          //  - If the MSB of fractional_part is set, then the fractional part
          //    must be at least 1/2.
          //  - When the MSB of fractional_part is set, either
          //    second_third_subsegments being nonzero or has_more_segments
          //    being true means there are further digits not printed, so the
          //    fractional part is strictly larger than 1/2.
          if (precision < 9) {
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (second_third_subsegments != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          // In this case, the fractional part is at least 1/2 if and only if
          // second_third_subsegments >= 5000000000ULL, and is strictly larger
          // than 1/2 if we further have either second_third_subsegments >
          // 5000000000ULL or has_more_segments == true.
          else {
            should_round_up = second_third_subsegments > 5000000000ULL ||
                              (second_third_subsegments == 5000000000ULL &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }
        // Otherwise, print the second subsegment.
        else {
          // Compilers are not aware of how to leverage the maximum value of
          // second_third_subsegments to find out a better magic number which
          // allows us to eliminate an additional shift. 1844674407370955162 =
          // ceil(2^64/10) < ceil(2^64*(10^9/(10^10 - 1))).
          const uint32_t second_subsegment =
              static_cast<uint32_t>(dragonbox::umul128_upper64(
                  second_third_subsegments, 1844674407370955162ULL));
          const uint32_t third_subsegment =
              static_cast<uint32_t>(second_third_subsegments) -
              second_subsegment * 10;

          number_of_digits_to_print = precision - 9;
          print_subsegment(second_subsegment, buf.data() + 9);

          // Rounding inside the subsegment.
          if (precision < 18) {
            // The condition third_subsegment != 0 implies that the segment was
            // of 19 digits, so in this case the third segment should be
            // consisting of a genuine digit from the input.
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (third_subsegment != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          else {
            // In this case, the segment must be of 19 digits, thus
            // the third subsegment should be consisting of a genuine digit from
            // the input.
            should_round_up = third_subsegment > 5 ||
                              (third_subsegment == 5 &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }

        // Round-up if necessary.
        if (should_round_up) {
          ++buf[precision - 1];
          for (int i = precision - 1; i > 0 && buf[i] > '9'; --i) {
            buf[i] = '0';
            ++buf[i - 1];
          }
          if (buf[0] > '9') {
            buf[0] = '1';
            if (fixed)
              buf[precision++] = '0';
            else
              ++exp;
          }
        }
        buf.try_resize(to_unsigned(precision));
      }
    }  // if (digits_in_the_first_segment > precision)
    else {
      // Adjust the exponent for its use in Dragon4.
      exp += digits_in_the_first_segment - 1;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}